

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::SetPolicy(cmMakefile *this,char *id,PolicyStatus status)

{
  pointer ppcVar1;
  bool bVar2;
  size_t sVar3;
  PolicyID pid;
  ostringstream e;
  undefined1 auStack_1c8 [12];
  PolicyID local_1bc;
  string local_1b8;
  undefined1 local_198 [376];
  
  bVar2 = cmPolicies::GetPolicyID(id,&local_1bc);
  if (bVar2) {
    bVar2 = SetPolicy(this,local_1bc,status);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Policy \"",8);
    if (id == (char *)0x0) {
      std::ios::clear((int)(auStack_1c8 + (long)*(_func_int **)(local_198._0_8_ + -0x18)) + 0x30);
    }
    else {
      sVar3 = strlen(id);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,id,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"\" is not known to this version of CMake.",0x28);
    std::__cxx11::stringbuf::str();
    ppcVar1 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar1) {
      ppcVar1[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_1b8,&this->Backtrace
                       );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmMakefile::SetPolicy(const char* id, cmPolicies::PolicyStatus status)
{
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id, /* out */ pid)) {
    std::ostringstream e;
    e << "Policy \"" << id << "\" is not known to this version of CMake.";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return false;
  }
  return this->SetPolicy(pid, status);
}